

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_gpu_texture.h
# Opt level: O2

int __thiscall basisu::gpu_image::init(gpu_image *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  uint32_t uVar2;
  int extraout_EAX;
  uint32_t in_ECX;
  uint32_t in_EDX;
  texture_format tVar3;
  
  tVar3 = (texture_format)ctx;
  this->m_fmt = tVar3;
  this->m_width = in_EDX;
  this->m_height = in_ECX;
  uVar1 = (uint)(tVar3 == cFXT1_RGB);
  this->m_block_width = uVar1 * 4 + 4;
  this->m_block_height = 4;
  this->m_blocks_x = in_EDX + uVar1 * 4 + 3 >> (tVar3 == cFXT1_RGB | 2U);
  this->m_blocks_y = in_ECX + 3 >> 2;
  if ((uint)tVar3 < 0x17) {
    uVar2 = *(uint32_t *)(&DAT_00303988 + ((ulong)ctx & 0xffffffff) * 4);
  }
  else {
    uVar2 = 2;
  }
  this->m_qwords_per_block = uVar2;
  vector<unsigned_long>::resize(&this->m_blocks,0,false);
  vector<unsigned_long>::resize
            (&this->m_blocks,(ulong)(this->m_blocks_y * this->m_blocks_x * this->m_qwords_per_block)
             ,false);
  return extraout_EAX;
}

Assistant:

void init(texture_format fmt, uint32_t width, uint32_t height)
		{
			m_fmt = fmt;
			m_width = width;
			m_height = height;
			m_block_width = basisu::get_block_width(m_fmt);
			m_block_height = basisu::get_block_height(m_fmt);
			m_blocks_x = (m_width + m_block_width - 1) / m_block_width;
			m_blocks_y = (m_height + m_block_height - 1) / m_block_height;
			m_qwords_per_block = basisu::get_qwords_per_block(m_fmt);

			m_blocks.resize(0);
			m_blocks.resize(m_blocks_x * m_blocks_y * m_qwords_per_block);
		}